

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelbin.cpp
# Opt level: O0

Mat * __thiscall ncnn::ModelBin::load(ModelBin *this,int w,int h,int c,int type)

{
  int in_ECX;
  int in_EDX;
  long *in_RSI;
  Mat *in_RDI;
  int in_R8D;
  undefined4 in_R9D;
  Mat m;
  void *local_d8;
  int *local_d0;
  size_t local_c8;
  int local_c0;
  Allocator *local_b8;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  size_t local_98;
  void **local_70;
  void **local_68;
  void **local_58;
  void **local_48;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined8 in_stack_ffffffffffffffc8;
  int iVar1;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  Mat *in_stack_ffffffffffffffd8;
  
  iVar1 = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  (**(code **)(*in_RSI + 0x10))(&local_d8,in_RSI,in_EDX * in_ECX * in_R8D,in_R9D);
  local_70 = &local_d8;
  if (local_d8 != (void *)0x0) {
    local_48 = local_70;
  }
  if (local_d8 != (void *)0x0 && local_98 * (long)local_a0 != 0) {
    Mat::reshape(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0,iVar1
                 ,(Allocator *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  }
  else {
    local_68 = &local_d8;
    in_RDI->data = local_d8;
    in_RDI->refcount = local_d0;
    in_RDI->elemsize = local_c8;
    in_RDI->elempack = local_c0;
    in_RDI->allocator = local_b8;
    in_RDI->dims = local_b0;
    in_RDI->w = local_ac;
    in_RDI->h = local_a8;
    in_RDI->d = local_a4;
    in_RDI->c = local_a0;
    in_RDI->cstep = local_98;
    if (in_RDI->refcount != (int *)0x0) {
      LOCK();
      *in_RDI->refcount = *in_RDI->refcount + 1;
      UNLOCK();
    }
  }
  local_58 = &local_d8;
  if (local_d0 != (int *)0x0) {
    LOCK();
    iVar1 = *local_d0;
    *local_d0 = *local_d0 + -1;
    UNLOCK();
    if (iVar1 == 1) {
      if (local_b8 == (Allocator *)0x0) {
        if (local_d8 != (void *)0x0) {
          free(local_d8);
        }
      }
      else {
        (*local_b8->_vptr_Allocator[3])(local_b8,local_d8);
      }
    }
  }
  return in_RDI;
}

Assistant:

Mat ModelBin::load(int w, int h, int c, int type) const
{
    Mat m = load(w * h * c, type);
    if (m.empty())
        return m;

    return m.reshape(w, h, c);
}